

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O0

MPP_RET bits_model_init(RcModelV2Ctx *ctx)

{
  int iVar1;
  RK_S32 RVar2;
  MPP_RET MVar3;
  RK_S64 RVar4;
  uint local_3c;
  long lStack_38;
  RK_U32 target_bps;
  RK_S64 gop_bits;
  RcFpsCfg *fps;
  RK_S32 gop_len;
  RcCfg *usr_cfg;
  RcModelV2Ctx *ctx_local;
  
  iVar1 = (ctx->usr_cfg).igop;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter %p\n","bits_model_init",ctx);
  }
  RVar2 = mpp_clip((ctx->usr_cfg).min_i_bit_prop,10,100);
  (ctx->usr_cfg).min_i_bit_prop = RVar2;
  RVar2 = mpp_clip((ctx->usr_cfg).max_i_bit_prop,(ctx->usr_cfg).min_i_bit_prop,100);
  (ctx->usr_cfg).max_i_bit_prop = RVar2;
  RVar2 = mpp_clip((ctx->usr_cfg).init_ip_ratio,0xa0,0x280);
  (ctx->usr_cfg).init_ip_ratio = RVar2;
  if ((rc_debug & 0x40) != 0) {
    _mpp_log_l(4,"rc_model_v2","min_i_bit_prop %d max_i_bit_prop %d, init_ip_ratio %d",
               "bits_model_init",(ulong)(uint)(ctx->usr_cfg).min_i_bit_prop,
               (ulong)(uint)(ctx->usr_cfg).max_i_bit_prop,(ctx->usr_cfg).init_ip_ratio);
  }
  if (iVar1 == 0) {
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","infinte gop, set default for rc bit calc\n","bits_model_init");
    }
    fps._4_4_ = 500;
    (ctx->usr_cfg).igop = 500;
  }
  else if (iVar1 == 1) {
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","all intra gop \n","bits_model_init");
    }
    (ctx->usr_cfg).init_ip_ratio = 0x10;
    if ((ctx->usr_cfg).debreath_cfg.enable != 0) {
      (ctx->usr_cfg).debreath_cfg.enable = 0;
    }
    fps._4_4_ = 500;
    (ctx->usr_cfg).igop = 500;
  }
  else {
    fps._4_4_ = mpp_clip((ctx->usr_cfg).igop,(ctx->usr_cfg).igop,500);
    (ctx->usr_cfg).igop = fps._4_4_;
  }
  ctx->max_still_qp = 0x23;
  ctx->motion_sensitivity = 0x5a;
  ctx->first_frm_flg = 1;
  ctx->gop_frm_cnt = 0;
  ctx->gop_qp_sum = 0;
  if ((ctx->usr_cfg).fps_chg_prop == 0) {
    (ctx->usr_cfg).fps_chg_prop = 0x19;
  }
  local_3c = (ctx->usr_cfg).bps_max;
  ctx->re_calc_ratio = reenc_calc_vbr_ratio;
  switch((ctx->usr_cfg).mode) {
  case RC_VBR:
    ctx->calc_ratio = calc_vbr_ratio;
    break;
  case RC_CBR:
    ctx->calc_ratio = calc_cbr_ratio;
    ctx->re_calc_ratio = reenc_calc_cbr_ratio;
    local_3c = (ctx->usr_cfg).bps_target;
    break;
  case RC_FIXQP:
    return MPP_OK;
  case RC_AVBR:
    ctx->calc_ratio = calc_avbr_ratio;
    if (((ctx->usr_cfg).bps_min == 0) || ((ctx->usr_cfg).bps_max == 0)) {
      ctx->min_still_percent = 0x19;
    }
    else {
      ctx->min_still_percent =
           (RK_U32)(((long)(ctx->usr_cfg).bps_min * 100) / (long)(ctx->usr_cfg).bps_max);
    }
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","min_still_percent  %d","bits_model_init",
                 (ulong)ctx->min_still_percent);
    }
    break;
  default:
    _mpp_log_l(4,"rc_model_v2","rc mode set error",(char *)0x0);
  }
  ctx->target_bps = (ctx->usr_cfg).bps_target;
  if (fps._4_4_ < 1) {
    lStack_38 = (long)(ctx->usr_cfg).fps.fps_out_num * (ulong)local_3c *
                (long)(ctx->usr_cfg).fps.fps_out_denom;
  }
  else {
    lStack_38 = (long)fps._4_4_ * (ulong)local_3c * (long)(ctx->usr_cfg).fps.fps_out_denom;
  }
  ctx->gop_total_bits = lStack_38 / (long)(ctx->usr_cfg).fps.fps_out_num;
  ctx->bit_per_frame =
       (local_3c * (ctx->usr_cfg).fps.fps_out_denom) / (uint)(ctx->usr_cfg).fps.fps_out_num;
  ctx->watl_thrd = local_3c * 3;
  ctx->stat_watl = ctx->watl_thrd >> 3;
  ctx->watl_base = ctx->stat_watl;
  ctx->last_fps = (ctx->usr_cfg).fps.fps_out_num / (ctx->usr_cfg).fps.fps_out_denom;
  if ((rc_debug & 0x40) != 0) {
    _mpp_log_l(4,"rc_model_v2","gop %d total bit %lld per_frame %d statistics time %d second\n",
               "bits_model_init",(ulong)(uint)(ctx->usr_cfg).igop,ctx->gop_total_bits,
               ctx->bit_per_frame,(ctx->usr_cfg).stats_time);
  }
  MVar3 = bits_model_param_init(ctx);
  if (MVar3 == MPP_OK) {
    RVar4 = mpp_time();
    ctx->time_base = RVar4;
    bits_frm_init(ctx);
    if ((rc_debug & 1) != 0) {
      _mpp_log_l(4,"rc_model_v2","leave %p\n","bits_model_init",ctx);
    }
    ctx_local._4_4_ = MPP_OK;
  }
  else {
    ctx_local._4_4_ = MPP_NOK;
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET bits_model_init(RcModelV2Ctx *ctx)
{
    RcCfg *usr_cfg = &ctx->usr_cfg;
    RK_S32 gop_len = ctx->usr_cfg.igop;
    RcFpsCfg *fps = &ctx->usr_cfg.fps;
    RK_S64 gop_bits = 0;
    RK_U32 target_bps = 0;

    rc_dbg_func("enter %p\n", ctx);

    usr_cfg->min_i_bit_prop = mpp_clip(usr_cfg->min_i_bit_prop, 10, 100);
    usr_cfg->max_i_bit_prop = mpp_clip(usr_cfg->max_i_bit_prop,
                                       usr_cfg->min_i_bit_prop, 100);
    usr_cfg->init_ip_ratio  = mpp_clip(usr_cfg->init_ip_ratio, 160, 640);

    rc_dbg_rc("min_i_bit_prop %d max_i_bit_prop %d, init_ip_ratio %d",
              usr_cfg->min_i_bit_prop, usr_cfg->max_i_bit_prop, usr_cfg->init_ip_ratio);

    if (!gop_len) {
        rc_dbg_rc("infinte gop, set default for rc bit calc\n");
        usr_cfg->igop = gop_len = 500;
    } else if (gop_len == 1) {
        rc_dbg_rc("all intra gop \n");
        usr_cfg->init_ip_ratio  = 16;

        /* disable debreath on all intra case */
        if (usr_cfg->debreath_cfg.enable)
            usr_cfg->debreath_cfg.enable = 0;

        usr_cfg->igop = gop_len = 500;
    } else {
        usr_cfg->igop = gop_len = mpp_clip(usr_cfg->igop, usr_cfg->igop, 500);
    }
    ctx->max_still_qp = 35;
    ctx->motion_sensitivity = 90;

    ctx->first_frm_flg = 1;
    ctx->gop_frm_cnt = 0;
    ctx->gop_qp_sum = 0;

    if (!usr_cfg->fps_chg_prop) {
        usr_cfg->fps_chg_prop = 25;
    }

    target_bps = ctx->usr_cfg.bps_max;
    ctx->re_calc_ratio = reenc_calc_vbr_ratio;
    switch (ctx->usr_cfg.mode) {
    case RC_CBR: {
        ctx->calc_ratio = calc_cbr_ratio;
        ctx->re_calc_ratio = reenc_calc_cbr_ratio;
        target_bps = ctx->usr_cfg.bps_target;
    } break;
    case RC_VBR: {
        ctx->calc_ratio = calc_vbr_ratio;
    } break;
    case RC_FIXQP: {
        return MPP_OK;
    }
    case RC_AVBR: {
        ctx->calc_ratio = calc_avbr_ratio;
        if (usr_cfg->bps_min && usr_cfg->bps_max) {
            ctx->min_still_percent = (RK_S64)usr_cfg->bps_min * 100 / usr_cfg->bps_max;
        } else {
            ctx->min_still_percent = 25;
        }
        rc_dbg_rc("min_still_percent  %d", ctx->min_still_percent);
    } break;
    default:
        mpp_log("rc mode set error");
        break;
    }

    ctx->target_bps = ctx->usr_cfg.bps_target;

    if (gop_len >= 1)
        gop_bits = (RK_S64)gop_len * target_bps * fps->fps_out_denom;
    else
        gop_bits = (RK_S64)fps->fps_out_num * target_bps * fps->fps_out_denom;

    ctx->gop_total_bits = gop_bits / fps->fps_out_num;
    ctx->bit_per_frame = target_bps * fps->fps_out_denom / fps->fps_out_num;
    ctx->watl_thrd = 3 * target_bps;
    ctx->stat_watl = ctx->watl_thrd  >> 3;
    ctx->watl_base = ctx->stat_watl;
    ctx->last_fps = fps->fps_out_num / fps->fps_out_denom;

    rc_dbg_rc("gop %d total bit %lld per_frame %d statistics time %d second\n",
              ctx->usr_cfg.igop, ctx->gop_total_bits, ctx->bit_per_frame,
              ctx->usr_cfg.stats_time);

    if (bits_model_param_init(ctx)) {
        return MPP_NOK;
    }
    ctx->time_base = mpp_time();
    bits_frm_init(ctx);
    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;
}